

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

lua_Number luaL_optnumber(lua_State *L,int idx,lua_Number def)

{
  int iVar1;
  TValue *L_00;
  int in_ESI;
  lua_State *in_RDI;
  lua_Number in_XMM0_Qa;
  TValue tmp;
  cTValue *o;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  lua_Number local_10;
  
  L_00 = index2adr(in_RDI,in_ESI);
  if ((L_00->field_2).it < 0xffff0000) {
    local_10 = (lua_Number)L_00->u64;
  }
  else {
    local_10 = in_XMM0_Qa;
    if ((L_00->field_2).it != 0xffffffff) {
      if (((L_00->field_2).it != 0xfffffffb) ||
         (iVar1 = lj_strscan_num((GCstr *)&L_00->field_2,
                                 (TValue *)
                                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)),
         iVar1 == 0)) {
        lj_err_argt((lua_State *)&L_00->field_2,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
        ;
      }
      local_10 = (lua_Number)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    }
  }
  return local_10;
}

Assistant:

LUALIB_API lua_Number luaL_optnumber(lua_State *L, int idx, lua_Number def)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o)))
    return numberVnum(o);
  else if (tvisnil(o))
    return def;
  else if (!(tvisstr(o) && lj_strscan_num(strV(o), &tmp)))
    lj_err_argt(L, idx, LUA_TNUMBER);
  return numV(&tmp);
}